

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

string * __thiscall
t_netstd_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_netstd_generator *this,t_type *ttype,bool with_namespace
          )

{
  string *__return_storage_ptr___00;
  uint uVar1;
  int iVar2;
  t_type *ptVar3;
  undefined4 extraout_var;
  t_program *this_00;
  ulong uVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  allocator local_1f9;
  string local_1f8;
  undefined1 local_1d8 [8];
  string ns;
  t_program *program;
  undefined1 local_190 [8];
  string the_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  t_map *local_130;
  t_list *tlist;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  t_map *local_e8;
  t_set *tset;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  t_map *local_30;
  t_map *tmap;
  t_map *ptStack_20;
  bool with_namespace_local;
  t_type *ttype_local;
  t_netstd_generator *this_local;
  
  tmap._7_1_ = with_namespace;
  ptStack_20 = (t_map *)ttype;
  ttype_local = (t_type *)this;
  this_local = (t_netstd_generator *)__return_storage_ptr__;
  ptStack_20 = (t_map *)resolve_typedef(ttype);
  uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[5])();
  if ((uVar1 & 1) != 0) {
    base_type_name_abi_cxx11_(__return_storage_ptr__,this,(t_base_type *)ptStack_20);
    return __return_storage_ptr__;
  }
  uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0x10])();
  if ((uVar1 & 1) != 0) {
    local_30 = ptStack_20;
    ptVar3 = t_map::get_key_type(ptStack_20);
    type_name_abi_cxx11_(&local_b0,this,ptVar3,true);
    std::operator+(&local_90,"Dictionary<",&local_b0);
    std::operator+(&local_70,&local_90,", ");
    ptVar3 = t_map::get_val_type(local_30);
    type_name_abi_cxx11_((string *)&tset,this,ptVar3,true);
    std::operator+(&local_50,&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tset);
    std::operator+(__return_storage_ptr__,&local_50,">");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&tset);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    return __return_storage_ptr__;
  }
  uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xf])();
  if ((uVar1 & 1) != 0) {
    local_e8 = ptStack_20;
    ptVar3 = t_set::get_elem_type((t_set *)ptStack_20);
    type_name_abi_cxx11_((string *)&tlist,this,ptVar3,true);
    std::operator+(&local_108,"THashSet<",(string *)&tlist);
    std::operator+(__return_storage_ptr__,&local_108,">");
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&tlist);
    return __return_storage_ptr__;
  }
  uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xe])();
  if ((uVar1 & 1) != 0) {
    local_130 = ptStack_20;
    ptVar3 = t_list::get_elem_type((t_list *)ptStack_20);
    __return_storage_ptr___00 = (string *)((long)&the_name.field_2 + 8);
    type_name_abi_cxx11_(__return_storage_ptr___00,this,ptVar3,true);
    std::operator+(&local_150,"List<",__return_storage_ptr___00);
    std::operator+(__return_storage_ptr__,&local_150,">");
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)(the_name.field_2._M_local_buf + 8));
    return __return_storage_ptr__;
  }
  iVar2 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string((string *)&program,(string *)CONCAT44(extraout_var,iVar2));
  normalize_name((string *)local_190,this,(string *)&program,false);
  std::__cxx11::string::~string((string *)&program);
  if (((tmap._7_1_ & 1) != 0) &&
     (this_00 = t_type::get_program((t_type *)ptStack_20), ns.field_2._8_8_ = this_00,
     this_00 != (t_program *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f8,"netstd",&local_1f9);
    t_program::get_namespace((string *)local_1d8,this_00,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    uVar4 = std::__cxx11::string::empty();
    bVar5 = (uVar4 & 1) == 0;
    if (bVar5) {
      std::operator+(&local_240,"global::",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8)
      ;
      std::operator+(&local_220,&local_240,".");
      std::operator+(__return_storage_ptr__,&local_220,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190)
      ;
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
    }
    std::__cxx11::string::~string((string *)local_1d8);
    if (bVar5) goto LAB_003a64fa;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_190);
LAB_003a64fa:
  std::__cxx11::string::~string((string *)local_190);
  return __return_storage_ptr__;
}

Assistant:

string t_netstd_generator::type_name(t_type* ttype, bool with_namespace)
{
    ttype = resolve_typedef(ttype);

    if (ttype->is_base_type())
    {
        return base_type_name(static_cast<t_base_type*>(ttype));
    }

    if (ttype->is_map())
    {
        t_map* tmap = static_cast<t_map*>(ttype);
        return "Dictionary<" + type_name(tmap->get_key_type()) + ", " + type_name(tmap->get_val_type()) + ">";
    }

    if (ttype->is_set())
    {
        t_set* tset = static_cast<t_set*>(ttype);
        return "THashSet<" + type_name(tset->get_elem_type()) + ">";
    }

    if (ttype->is_list())
    {
        t_list* tlist = static_cast<t_list*>(ttype);
        return "List<" + type_name(tlist->get_elem_type()) + ">";
    }

    string the_name = normalize_name(ttype->get_name());

    if(with_namespace)
    {
        t_program* program = ttype->get_program();
        if (program != nullptr)// && program != program_)
        {
            string ns =  program->get_namespace("netstd");
            if (!ns.empty())
            {
                return "global::" + ns + "." + the_name;
            }
        }
    }

    return the_name;
}